

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

parser_error parse_prefs_gf(parser *p)

{
  char cVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *__s;
  char *pcVar6;
  long lVar7;
  long lVar8;
  _Bool types [56];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pcVar6 = (char *)&local_68;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = 0;
  pcVar5 = (char *)parser_priv(p);
  if (pcVar5 == (char *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x35e,"enum parser_error parse_prefs_gf(struct parser *)");
  }
  if (*pcVar5 != '\0') {
    return PARSE_ERROR_NONE;
  }
  pcVar5 = parser_getsym(p,"type");
  __s = string_make(pcVar5);
  pcVar5 = strtok(__s,"| ");
  while (pcVar5 != (char *)0x0) {
    if ((*pcVar5 == '*') && (pcVar5[1] == '\0')) {
      local_38 = 0x101010101010101;
      local_68 = 0x101010101010101;
      uStack_60 = 0x101010101010101;
      local_58 = local_68;
      uStack_50 = uStack_60;
      local_48 = local_68;
      uStack_40 = uStack_60;
    }
    else {
      wVar2 = proj_name_to_idx(pcVar5);
      if (wVar2 == L'\xffffffff') {
        return PARSE_ERROR_INVALID_VALUE;
      }
      *(undefined1 *)((long)&local_68 + (long)wVar2) = 1;
    }
    pcVar5 = strtok((char *)0x0,"| ");
  }
  string_free(__s);
  pcVar5 = parser_getsym(p,"direction");
  iVar3 = strcmp(pcVar5,"static");
  if (iVar3 == 0) {
    lVar7 = 0;
  }
  else {
    cVar1 = *pcVar5;
    if (cVar1 == '9') {
      if ((pcVar5[1] == '0') && (pcVar5[2] == '\0')) {
        lVar7 = 3;
        goto LAB_001e8a57;
      }
    }
    else if (cVar1 == '4') {
      if ((pcVar5[1] == '5') && (pcVar5[2] == '\0')) {
        lVar7 = 2;
        goto LAB_001e8a57;
      }
    }
    else if ((cVar1 == '0') && (pcVar5[1] == '\0')) {
      lVar7 = 1;
      goto LAB_001e8a57;
    }
    iVar3 = strcmp(pcVar5,"135");
    if (iVar3 != 0) {
      return PARSE_ERROR_INVALID_VALUE;
    }
    lVar7 = 4;
  }
LAB_001e8a57:
  lVar8 = 0;
  do {
    if (*pcVar6 == '\x01') {
      uVar4 = parser_getuint(p,"attr");
      proj_to_attr[0][lVar8 + lVar7] = (uint8_t)uVar4;
      uVar4 = parser_getuint(p,"char");
      *(uint *)((long)proj_to_char[0] + lVar8 * 4 + (ulong)(uint)((int)lVar7 << 2)) = uVar4;
    }
    lVar8 = lVar8 + 5;
    pcVar6 = pcVar6 + 1;
  } while (lVar8 != 0x118);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_prefs_gf(struct parser *p)
{
	bool types[PROJ_MAX] = { 0 };
	const char *direction;
	int motion;

	char *s, *t;

	size_t i;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	/* Parse the type, which is a | separated list of PROJ_ constants */
	s = string_make(parser_getsym(p, "type"));
	t = strtok(s, "| ");
	while (t) {
		if (streq(t, "*")) {
			memset(types, true, sizeof types);
		} else {
			int idx = proj_name_to_idx(t);
			if (idx == -1)
				return PARSE_ERROR_INVALID_VALUE;

			types[idx] = true;
		}

		t = strtok(NULL, "| ");
	}

	string_free(s);

	direction = parser_getsym(p, "direction");
	if (streq(direction, "static"))
		motion = BOLT_NO_MOTION;
	else if (streq(direction, "0"))
		motion = BOLT_0;
	else if (streq(direction, "45"))
		motion = BOLT_45;
	else if (streq(direction, "90"))
		motion = BOLT_90;
	else if (streq(direction, "135"))
		motion = BOLT_135;
	else
		return PARSE_ERROR_INVALID_VALUE;

	for (i = 0; i < PROJ_MAX; i++) {
		if (!types[i]) continue;

		proj_to_attr[i][motion] = (uint8_t)parser_getuint(p, "attr");
		proj_to_char[i][motion] = (wchar_t)parser_getuint(p, "char");
	}

	return PARSE_ERROR_NONE;
}